

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_hash(ssh_hashalg *halg)

{
  ssh_hash *psVar1;
  void *ptr;
  uchar *ptr_00;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  
  psVar1 = ssh_hash_new(halg);
  if (psVar1 != (ssh_hash *)0x0) {
    uVar3 = 0;
    ptr = safemalloc(0x100,1,0);
    ptr_00 = (uchar *)safemalloc(halg->hlen,1,0);
    while( true ) {
      sVar2 = (*looplimit)(0x10);
      if (sVar2 <= uVar3) break;
      random_read(ptr,0x100);
      log_start();
      BinarySink_put_data(psVar1->binarysink_,ptr,0x100);
      (*psVar1->vt->digest)(psVar1,ptr_00);
      (*psVar1->vt->free)(psVar1);
      log_end();
      psVar1 = ssh_hash_new(halg);
      uVar3 = uVar3 + 1;
    }
    safefree(ptr);
    safefree(ptr_00);
    (*psVar1->vt->free)(psVar1);
    return;
  }
  test_skipped = 1;
  return;
}

Assistant:

static void test_hash(const ssh_hashalg *halg)
{
    ssh_hash *h = ssh_hash_new(halg);
    if (!h) {
        test_skipped = true;
        return;
    }

    size_t datalen = 256;
    uint8_t *data = snewn(datalen, uint8_t);
    uint8_t *hash = snewn(halg->hlen, uint8_t);

    for (size_t i = 0; i < looplimit(16); i++) {
        random_read(data, datalen);

        log_start();
        put_data(h, data, datalen);
        ssh_hash_final(h, hash);
        log_end();

        h = ssh_hash_new(halg);
    }

    sfree(data);
    sfree(hash);
    ssh_hash_free(h);
}